

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O0

void __thiscall
cmCustomCommandGenerator::AppendArguments(cmCustomCommandGenerator *this,uint c,string *cmd)

{
  cmLocalGenerator *pcVar1;
  string_view sVar2;
  bool bVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  const_reference pvVar7;
  bool local_171;
  char *local_170;
  bool local_141;
  string local_120;
  string local_100;
  char *local_e0;
  char *location;
  string arg;
  uint j_1;
  cmCustomCommandLine *commandLine;
  string local_98;
  string local_78;
  uint local_44;
  undefined1 local_40 [4];
  uint j;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emulator;
  uint offset;
  string *cmd_local;
  uint c_local;
  cmCustomCommandGenerator *this_local;
  
  emulator.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  GetCrossCompilingEmulator_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_40,this,c);
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_40);
  if (!bVar3) {
    local_44 = 1;
    while( true ) {
      uVar4 = (ulong)local_44;
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_40);
      if (sVar5 <= uVar4) break;
      std::__cxx11::string::operator+=((string *)cmd," ");
      if ((this->OldStyle & 1U) == 0) {
        pcVar1 = this->LG;
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_40,(ulong)local_44);
        sVar2 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar6);
        bVar3 = this->MakeVars;
        local_141 = false;
        if ((this->MakeVars & 1U) != 0) {
          local_141 = cmLocalGenerator::IsNinjaMulti(this->LG);
        }
        cmOutputConverter::EscapeForShell_abi_cxx11_
                  (&local_98,&pcVar1->super_cmOutputConverter,sVar2,(bool)(bVar3 & 1),false,false,
                   local_141,false);
        std::__cxx11::string::operator+=((string *)cmd,(string *)&local_98);
        std::__cxx11::string::~string((string *)&local_98);
      }
      else {
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_40,(ulong)local_44);
        escapeForShellOldStyle(&local_78,pvVar6);
        std::__cxx11::string::operator+=((string *)cmd,(string *)&local_78);
        std::__cxx11::string::~string((string *)&local_78);
      }
      local_44 = local_44 + 1;
    }
    emulator.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  }
  this_00 = &std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::operator[]
                       (&(this->CommandLines).
                         super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                        (ulong)c)->
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  arg.field_2._12_4_ =
       emulator.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  while( true ) {
    uVar4 = (ulong)(uint)arg.field_2._12_4_;
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(this_00);
    if (sVar5 <= uVar4) break;
    std::__cxx11::string::string((string *)&location);
    if (arg.field_2._12_4_ == 0) {
      local_170 = GetArgv0Location(this,c);
    }
    else {
      local_170 = (char *)0x0;
    }
    local_e0 = local_170;
    if (local_170 == (char *)0x0) {
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](this_00,(ulong)(uint)arg.field_2._12_4_);
      std::__cxx11::string::operator=((string *)&location,(string *)pvVar7);
    }
    else {
      std::__cxx11::string::operator=((string *)&location,local_170);
    }
    std::__cxx11::string::operator+=((string *)cmd," ");
    if ((this->OldStyle & 1U) == 0) {
      pcVar1 = this->LG;
      sVar2 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&location);
      bVar3 = this->MakeVars;
      local_171 = false;
      if ((this->MakeVars & 1U) != 0) {
        local_171 = cmLocalGenerator::IsNinjaMulti(this->LG);
      }
      cmOutputConverter::EscapeForShell_abi_cxx11_
                (&local_120,&pcVar1->super_cmOutputConverter,sVar2,(bool)(bVar3 & 1),false,false,
                 local_171,false);
      std::__cxx11::string::operator+=((string *)cmd,(string *)&local_120);
      std::__cxx11::string::~string((string *)&local_120);
    }
    else {
      escapeForShellOldStyle(&local_100,(string *)&location);
      std::__cxx11::string::operator+=((string *)cmd,(string *)&local_100);
      std::__cxx11::string::~string((string *)&local_100);
    }
    std::__cxx11::string::~string((string *)&location);
    arg.field_2._12_4_ = arg.field_2._12_4_ + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_40);
  return;
}

Assistant:

void cmCustomCommandGenerator::AppendArguments(unsigned int c,
                                               std::string& cmd) const
{
  unsigned int offset = 1;
  std::vector<std::string> emulator = this->GetCrossCompilingEmulator(c);
  if (!emulator.empty()) {
    for (unsigned j = 1; j < emulator.size(); ++j) {
      cmd += " ";
      if (this->OldStyle) {
        cmd += escapeForShellOldStyle(emulator[j]);
      } else {
        cmd +=
          this->LG->EscapeForShell(emulator[j], this->MakeVars, false, false,
                                   this->MakeVars && this->LG->IsNinjaMulti());
      }
    }

    offset = 0;
  }

  cmCustomCommandLine const& commandLine = this->CommandLines[c];
  for (unsigned int j = offset; j < commandLine.size(); ++j) {
    std::string arg;
    if (const char* location = j == 0 ? this->GetArgv0Location(c) : nullptr) {
      // GetCommand returned the emulator instead of the argv0 location,
      // so transform the latter now.
      arg = location;
    } else {
      arg = commandLine[j];
    }
    cmd += " ";
    if (this->OldStyle) {
      cmd += escapeForShellOldStyle(arg);
    } else {
      cmd +=
        this->LG->EscapeForShell(arg, this->MakeVars, false, false,
                                 this->MakeVars && this->LG->IsNinjaMulti());
    }
  }
}